

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<std::string,_cmCMakePresetsGraph::ReadFileResult> *
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::String
          (cmJSONHelper<std::string,_cmCMakePresetsGraph::ReadFileResult> *__return_storage_ptr__,
          ReadFileResult success,ReadFileResult fail,string *defval)

{
  anon_class_40_3_5a0d8fdd local_48;
  string *local_20;
  string *defval_local;
  ReadFileResult fail_local;
  ReadFileResult success_local;
  
  local_48.success = success;
  local_48.fail = fail;
  local_20 = defval;
  defval_local._0_4_ = fail;
  defval_local._4_4_ = success;
  _fail_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_48.defval,(string *)defval);
  std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::String(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult,std::__cxx11::string_const&)::_lambda(std::__cxx11::string&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>
              *)__return_storage_ptr__,&local_48);
  String(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult,std::__cxx11::string_const&)
  ::{lambda(std::__cxx11::string&,Json::Value_const*)#1}::~Value
            ((_lambda_std____cxx11__string__Json__Value_const___1_ *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::string, E, CallState...> String(
    E success, E fail, const std::string& defval = "")
  {
    return [success, fail, defval](std::string& out, const Json::Value* value,
                                   CallState&&... /*state*/) -> E {
      if (!value) {
        out = defval;
        return success;
      }
      if (!value->isString()) {
        return fail;
      }
      out = value->asString();
      return success;
    };
  }